

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

char * rapidjson::internal::dtoa(double value,char *buffer,int maxDecimalPlaces)

{
  char *pcVar1;
  int local_30;
  int local_2c;
  int length;
  int K;
  
  if (0 < maxDecimalPlaces) {
    if ((value != 0.0) || (NAN(value))) {
      if (value < 0.0) {
        *buffer = '-';
        buffer = buffer + 1;
        value = -value;
      }
      Grisu2(value,buffer,&local_30,&local_2c);
      pcVar1 = Prettify(buffer,local_30,local_2c,maxDecimalPlaces);
    }
    else {
      if ((long)value < 0) {
        *buffer = '-';
        buffer = buffer + 1;
      }
      buffer[0] = '0';
      buffer[1] = '.';
      buffer[2] = '0';
      pcVar1 = buffer + 3;
    }
    return pcVar1;
  }
  __assert_fail("maxDecimalPlaces >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/internal/dtoa.h"
                ,0xd9,"char *rapidjson::internal::dtoa(double, char *, int)");
}

Assistant:

inline char* dtoa(double value, char* buffer, int maxDecimalPlaces = 324) {
    RAPIDJSON_ASSERT(maxDecimalPlaces >= 1);
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K, maxDecimalPlaces);
    }
}